

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_sol.h
# Opt level: O3

void __thiscall
ExampleSOLHandler::OnIntSuffix<mp::SuffixReader<int>>(ExampleSOLHandler *this,SuffixReader<int> *sr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ExampleModel *pEVar3;
  pointer pcVar4;
  mapped_type *this_00;
  pair<int,_int> pVar5;
  pointer pdVar6;
  key_type local_58;
  
  iVar2 = (sr->si_).kind_;
  pEVar3 = this->mdl_;
  paVar1 = &local_58.first.field_2;
  pcVar4 = (sr->si_).name_._M_dataplus._M_p;
  local_58.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar4,pcVar4 + (sr->si_).name_._M_string_length);
  local_58.second = iVar2;
  this_00 = std::
            map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
            ::operator[](&pEVar3->suf_out_,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.first._M_dataplus._M_p,local_58.first.field_2._M_allocated_capacity + 1
                   );
  }
  iVar2 = (sr->super_SparseVecReader<int>).n_;
  while (iVar2 != 0) {
    pVar5 = mp::VecReader<std::pair<int,_int>_>::ReadNext(&sr->super_SparseVecReader<int>);
    pdVar6 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <=
        (ulong)(long)pVar5.first) {
      std::vector<double,_std::allocator<double>_>::resize
                (this_00,((long)pVar5 << 0x20) + 0x100000000 >> 0x20);
      pdVar6 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    pdVar6[pVar5.first] = (double)pVar5.second;
    iVar2 = (sr->super_SparseVecReader<int>).n_;
  }
  return;
}

Assistant:

void OnIntSuffix(SuffixReader& sr) {
    const auto& si = sr.SufInfo();
    int kind = si.Kind();
    const std::string& name = si.Name();
    assert(0 == (kind & 4));
    auto& suf_val = Model().suf_out_[std::make_pair(name, kind)];
    while (sr.Size()) {
      std::pair<int, int> val = sr.ReadNext();
      if (suf_val.size() <= val.first)
        suf_val.resize(val.first+1);
      suf_val[val.first] = val.second;
    }
  }